

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void cleanup(EVP_PKEY_CTX *ctx)

{
  void *in_RSI;
  
  if ((((ulong)ctx & 8) != 0) && (*(void **)((long)in_RSI + 0x38) != (void *)0x0)) {
    free(*(void **)((long)in_RSI + 0x38));
  }
  if (*(void **)((long)in_RSI + 0x30) != (void *)0x0) {
    free(*(void **)((long)in_RSI + 0x30));
  }
  free(in_RSI);
  return;
}

Assistant:

static void cleanup(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (strm->flags & AEC_DATA_PREPROCESS && state->data_raw)
        free(state->data_raw);
    if (state->data_pp)
        free(state->data_pp);
    free(state);
}